

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balk.cpp
# Opt level: O0

void __thiscall Balk::add_uniform_load(Balk *this,int shift,double segment_length,double value)

{
  shared_ptr<UniformLoad> local_48;
  shared_ptr<Term> local_38;
  double local_28;
  double value_local;
  double segment_length_local;
  Balk *pBStack_10;
  int shift_local;
  Balk *this_local;
  
  local_28 = value;
  value_local = segment_length;
  segment_length_local._4_4_ = shift;
  pBStack_10 = this;
  std::make_shared<UniformLoad,int&,double&,double&>
            ((int *)&local_48,(double *)((long)&segment_length_local + 4),&value_local);
  std::shared_ptr<Term>::shared_ptr<UniformLoad,void>(&local_38,&local_48);
  std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::push_back
            (&this->terms,&local_38);
  std::shared_ptr<Term>::~shared_ptr(&local_38);
  std::shared_ptr<UniformLoad>::~shared_ptr(&local_48);
  return;
}

Assistant:

void Balk::add_uniform_load(int shift, double segment_length, double value)
{
    terms.push_back(std::make_shared<UniformLoad>(shift, segment_length, value));
}